

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_poll.c
# Opt level: O3

int mpt_stream_poll(mpt_stream *srm,int what,int timeout)

{
  mpt_decode_queue *pmVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  ushort uVar7;
  pollfd *__fds;
  uint uVar8;
  bool bVar9;
  pollfd fd [2];
  pollfd local_48;
  pollfd local_40 [2];
  
  uVar3 = mpt_stream_flags(&srm->_info);
  uVar8 = what & 0xfffffffe;
  if ((uVar3 & 0x10) != 0) {
    uVar8 = what;
  }
  uVar2 = uVar8 & 0xfffffffb;
  if ((uVar3 & 0x20) != 0) {
    uVar2 = uVar8;
  }
  if ((timeout < 0) && (uVar2 == 1)) {
    local_48.fd = _mpt_stream_fread(&srm->_info);
    local_48.revents = 1;
    local_40[0].fd = -1;
  }
  else if ((timeout < 0) && (uVar2 == 4)) {
    local_48.fd = -1;
    local_48.revents = 0;
    local_40[0].fd = _mpt_stream_fread(&srm->_info);
    local_40[0].revents = 4;
  }
  else {
    local_40[0].revents = 0;
    local_48.revents = 0;
    iVar4 = _mpt_stream_fread(&srm->_info);
    local_48.fd = iVar4;
    local_40[0].fd = _mpt_stream_fwrite(&srm->_info);
    uVar7 = (ushort)uVar2 & 0xfffb;
    local_48.events = uVar7;
    if (iVar4 < 0) {
      local_48.events = 0;
    }
    local_40[0].events = (ushort)uVar2 & 0xfffe;
    if (local_40[0].fd < 0) {
      local_40[0].events = 0;
    }
    if (iVar4 == local_40[0].fd) {
      if (iVar4 < 0) {
        piVar6 = __errno_location();
        *piVar6 = 0xb;
        return -2;
      }
      local_48.events = local_40[0].events | uVar7;
    }
    bVar9 = iVar4 == local_40[0].fd;
    __fds = &local_48;
    if (iVar4 < 0) {
      __fds = local_40;
    }
    iVar4 = poll(__fds,2 - (ulong)(iVar4 < 0 || bVar9),timeout);
    if (iVar4 < 0 || !bVar9) {
      if (iVar4 < 0) {
        return iVar4;
      }
    }
    else {
      local_48.revents = local_48.revents | local_40[0].revents;
    }
  }
  if (local_48.fd < 0) {
    uVar8 = (uint)((srm->_rd).data.len != 0) * 3 - 3;
    goto LAB_00107be6;
  }
  pmVar1 = &srm->_rd;
  mpt_queue_shift(pmVar1);
  if ((local_48.revents & 1U) == 0) {
    uVar8 = 0xfffffffd;
    if (-1 < (srm->_rd)._state.data.msg) {
      uVar8 = uVar2 & 1;
    }
  }
  else {
    if (((srm->_rd).data.len == (srm->_rd).data.max) &&
       (((char)uVar3 < '\0' || (lVar5 = mpt_queue_prepare(pmVar1,0x40), lVar5 == 0)))) {
      iVar4 = 4;
LAB_00107bc0:
      mpt_stream_seterror(&srm->_info,iVar4);
    }
    else {
      lVar5 = mpt_queue_load(pmVar1,local_48.fd,0);
      if (0 < lVar5) {
        mpt_stream_clearerror(&srm->_info,5);
        uVar8 = 1;
        goto LAB_00107bcb;
      }
      if (lVar5 != 0) {
        iVar4 = (uint)((local_48.revents & 0x10U) == 0) * 3 + 1;
        goto LAB_00107bc0;
      }
      local_48.revents = local_48.revents | 0x10;
    }
    uVar8 = 0xfffffffd;
  }
LAB_00107bcb:
  if ((local_48.revents & 0x11U) == 0x10) {
    mpt_stream_seterror(&srm->_info,4);
  }
LAB_00107be6:
  if (-1 < local_40[0].fd) {
    if ((local_48.revents & 4U) == 0) {
      uVar3 = 0;
      if (0 < (int)uVar8) {
        uVar3 = uVar8;
      }
      if ((srm->_wd)._state.done != 0) {
        uVar8 = uVar3;
      }
    }
    else {
      iVar4 = mpt_stream_flush(srm);
      if (-1 < iVar4) {
        uVar3 = 4;
        if (-1 < (int)uVar8) {
          uVar3 = uVar8 | 4;
        }
        if (iVar4 != 0) {
          uVar8 = uVar3;
        }
        mpt_stream_clearerror(&srm->_info,10);
      }
    }
  }
  return uVar8;
}

Assistant:

extern int mpt_stream_poll(MPT_STRUCT(stream) *srm, int what, int timeout)
{
	struct pollfd fd[2];
	int flags, keep;
	
	flags = mpt_stream_flags(&srm->_info);
	
	if (!(flags & MPT_STREAMFLAG(ReadBuf))) {
		what &= ~POLLIN;
	}
	if (!(flags & MPT_STREAMFLAG(WriteBuf))) {
		what &= ~POLLOUT;
	}
	/* fast path for available input */
	if (timeout < 0 && what == POLLIN) {
		fd[0].fd = _mpt_stream_fread(&srm->_info);
		fd[0].revents = what;
		fd[1].fd = -1;
	}
	/* fast path for output */
	else if (timeout < 0 && what == POLLOUT) {
		fd[0].fd = -1;
		fd[0].revents = 0;
		fd[1].fd = _mpt_stream_fread(&srm->_info);
		fd[1].revents = what;
	}
	/* wait for inputs */
	else {
		int shared;
		fd[0].revents = fd[1].revents = 0;
		
		fd[0].fd = _mpt_stream_fread(&srm->_info);
		fd[1].fd = _mpt_stream_fwrite(&srm->_info);
		
		fd[0].events = fd[0].fd < 0 ? 0 : (what & ~POLLOUT);
		fd[1].events = fd[1].fd < 0 ? 0 : (what & ~POLLIN);
		
		if ((shared = (fd[0].fd == fd[1].fd))) {
			if (fd[0].fd < 0) {
				errno = EAGAIN;
				return -2;
			}
			fd[0].events |= fd[1].events;
		}
		if ((keep = poll(fd[0].fd < 0 ? fd+1 : fd, shared || fd[0].fd < 0 ? 1 : 2, timeout)) < 0) {
			return keep;
		}
		if (shared) fd[0].revents |= fd[1].revents;
	}
	keep = -3;
	
	if (fd[0].fd >= 0) {
		ssize_t len;
		
		mpt_queue_shift(&srm->_rd);
		
		/* avoid removal if input available */
		if (!(fd[0].revents & POLLIN)) {
			if (srm->_rd._state.data.msg >= 0) {
				keep = what & POLLIN;
			}
		}
		/* prepare input buffer */
		else if ((srm->_rd.data.len == srm->_rd.data.max)
		         && ((flags & MPT_STREAMFLAG(WriteMap)) || !mpt_queue_prepare(&srm->_rd.data, 64))) {
			mpt_stream_seterror(&srm->_info, MPT_ENUM(ErrorRead));
		}
		/* read further input data */
		else if ((len = mpt_queue_load(&srm->_rd.data, fd[0].fd, 0)) > 0) {
			mpt_stream_clearerror(&srm->_info, MPT_ENUM(ErrorEmpty) | MPT_ENUM(ErrorRead));
			keep = POLLIN;
		}
		/* regular close */
		else if (!len) {
			fd[0].revents |= POLLHUP;
		}
		/* irregular operation */
		else {
			mpt_stream_seterror(&srm->_info, (fd[0].revents & POLLHUP) ? MPT_ENUM(ErrorEmpty) : MPT_ENUM(ErrorRead));
		}
		/* all available data reveived */
		if (fd[0].revents & POLLHUP
		    && !(fd[0].revents & POLLIN)) {
			mpt_stream_seterror(&srm->_info, MPT_ENUM(ErrorRead));
		}
	}
	else if (srm->_rd.data.len) {
		keep = 0;
	}
	if (fd[1].fd >= 0) {
		/* avoid removal if input not queried */
		if (!(fd[0].revents & POLLOUT)) {
			if (srm->_wd._state.done && keep < 0) {
				keep = 0;
			}
		}
		/* remaining data on output */
		else {
			int ret;
			
			if ((ret = mpt_stream_flush(srm)) < 0) {
				return keep;
			}
			if (ret) {
				if (keep < 0) keep = POLLOUT;
				else keep |= POLLOUT;
			}
			mpt_stream_clearerror(&srm->_info, MPT_ENUM(ErrorFull) | MPT_ENUM(ErrorWrite));
		}
	}
	return keep;
}